

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O2

ngx_int_t ngx_hash_add_key(ngx_hash_keys_arrays_t *ha,ngx_str_t *key,void *value,ngx_uint_t flags)

{
  byte bVar1;
  u_char uVar2;
  int iVar3;
  ulong uVar4;
  ngx_int_t nVar5;
  size_t *psVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  size_t *psVar10;
  ulong uVar11;
  size_t sVar12;
  ngx_array_t *pnVar13;
  u_char *puVar14;
  byte bVar15;
  undefined8 *puVar16;
  ngx_uint_t nVar17;
  size_t sVar18;
  ulong size;
  bool bVar19;
  bool bVar20;
  long lStack_70;
  u_char *local_40;
  
  size = key->len;
  if ((flags & 1) != 0) {
    bVar19 = false;
    for (uVar4 = 0; size != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = key->data[uVar4];
      if (uVar2 == '*') {
        bVar20 = true;
        if (bVar19) {
          return -5;
        }
      }
      else {
        bVar20 = bVar19;
        if (uVar2 == '.') {
          if (key->data[uVar4 + 1] == '.') {
            return -5;
          }
        }
        else if (uVar2 == '\0') {
          return -5;
        }
      }
      bVar19 = bVar20;
    }
    if (1 < size) {
      puVar14 = key->data;
      uVar2 = *puVar14;
      if (uVar2 == '.') {
        lStack_70 = 1;
LAB_001150f5:
        bVar19 = false;
        lVar7 = lStack_70;
      }
      else {
        if (size == 2) goto LAB_00115254;
        if ((uVar2 == '*') && (puVar14[1] == '.')) {
          lStack_70 = 2;
          goto LAB_001150f5;
        }
        if ((puVar14[size - 2] != '.') || (puVar14[size - 1] != '*')) goto LAB_00115254;
        size = size - 2;
        bVar19 = true;
        lVar7 = 0;
      }
      sVar18 = size - lVar7;
      nVar17 = ngx_hash_strlow(puVar14 + lVar7,puVar14 + lVar7,sVar18);
      uVar4 = nVar17 % ha->hsize;
      if (uVar2 == '.') {
        pnVar13 = ha->keys_hash;
        if (pnVar13[uVar4].elts == (void *)0x0) {
          nVar5 = ngx_array_init(pnVar13 + uVar4,ha->temp_pool,4,0x10);
          if (nVar5 != 0) {
            return -1;
          }
          pnVar13 = ha->keys_hash;
        }
        else {
          nVar17 = pnVar13[uVar4].nelts;
          puVar16 = (undefined8 *)((long)pnVar13[uVar4].elts + 8);
          while (bVar20 = nVar17 != 0, nVar17 = nVar17 - 1, bVar20) {
            if ((sVar18 == puVar16[-1]) &&
               (iVar3 = strncmp((char *)(key->data + 1),(char *)*puVar16,sVar18), iVar3 == 0)) {
              return -3;
            }
            puVar16 = puVar16 + 2;
          }
        }
        psVar6 = (size_t *)ngx_array_push(pnVar13 + uVar4);
        if (psVar6 == (size_t *)0x0) {
          return -1;
        }
        *psVar6 = size - 1;
        pvVar8 = ngx_pnalloc(ha->temp_pool,size - 1);
        psVar6[1] = (size_t)pvVar8;
        if (pvVar8 == (void *)0x0) {
          return -1;
        }
        memcpy(pvVar8,key->data + 1,*psVar6);
      }
      if (!bVar19) {
        local_40 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
        if (local_40 == (u_char *)0x0) {
          return -1;
        }
        lVar9 = 0;
        sVar18 = size;
        do {
          uVar11 = 0;
          sVar12 = sVar18;
          while( true ) {
            if (sVar18 - 1 == uVar11) {
              if (uVar11 != 0) {
                memcpy(local_40 + lVar9,key->data + 1,uVar11);
                lVar9 = lVar9 + uVar11;
              }
              local_40[lVar9] = '\0';
              lVar9 = 0x70;
              lStack_70 = 0x48;
              goto LAB_001153c9;
            }
            if (key->data[sVar12 - 1] == '.') break;
            uVar11 = uVar11 + 1;
            sVar12 = sVar12 - 1;
          }
          puVar14 = local_40 + lVar9;
          memcpy(puVar14,key->data + sVar12,uVar11);
          lVar9 = lVar9 + uVar11 + 1;
          puVar14[uVar11] = '.';
          sVar18 = sVar18 + ~uVar11;
        } while( true );
      }
      size = size + 1;
      local_40 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
      if (local_40 == (u_char *)0x0) {
        return -1;
      }
      ngx_cpystrn(local_40,key->data,size);
      lVar9 = 0xa0;
      lStack_70 = 0x78;
LAB_001153c9:
      lVar9 = *(long *)((long)&ha->hsize + lVar9);
      pnVar13 = (ngx_array_t *)(lVar9 + uVar4 * 0x28);
      lVar9 = *(long *)(lVar9 + uVar4 * 0x28);
      if (lVar9 == 0) {
        nVar5 = ngx_array_init(pnVar13,ha->temp_pool,4,0x10);
        if (nVar5 != 0) {
          return -1;
        }
      }
      else {
        nVar17 = pnVar13->nelts;
        puVar16 = (undefined8 *)(lVar9 + 8);
        while (bVar19 = nVar17 != 0, nVar17 = nVar17 - 1, bVar19) {
          if ((size - lVar7 == puVar16[-1]) &&
             (iVar3 = strncmp((char *)(key->data + lVar7),(char *)*puVar16,size - lVar7), iVar3 == 0
             )) {
            return -3;
          }
          puVar16 = puVar16 + 2;
        }
      }
      psVar10 = (size_t *)ngx_array_push(pnVar13);
      if (psVar10 == (size_t *)0x0) {
        return -1;
      }
      *psVar10 = size - lVar7;
      pvVar8 = ngx_pnalloc(ha->temp_pool,size - lVar7);
      psVar10[1] = (size_t)pvVar8;
      if (pvVar8 == (void *)0x0) {
        return -1;
      }
      memcpy(pvVar8,key->data + lVar7,*psVar10);
      psVar6 = (size_t *)ngx_array_push((ngx_array_t *)((long)&ha->hsize + lStack_70));
      if (psVar6 == (size_t *)0x0) {
        return -1;
      }
      *psVar6 = size - 1;
      psVar6[1] = (size_t)local_40;
      nVar17 = 0;
      goto LAB_00115205;
    }
LAB_00115254:
    if (bVar19) {
      return -5;
    }
  }
  uVar4 = 0;
  for (uVar11 = 0; size != uVar11; uVar11 = uVar11 + 1) {
    puVar14 = key->data;
    if ((flags & 2) == 0) {
      bVar1 = puVar14[uVar11];
      bVar15 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar15 = bVar1;
      }
      puVar14[uVar11] = bVar15;
      puVar14 = key->data;
    }
    uVar4 = (ulong)puVar14[uVar11] + uVar4 * 0x1f;
  }
  uVar4 = uVar4 % ha->hsize;
  pnVar13 = ha->keys_hash;
  if (pnVar13[uVar4].elts == (void *)0x0) {
    nVar5 = ngx_array_init(pnVar13 + uVar4,ha->temp_pool,4,0x10);
    if (nVar5 != 0) {
      return -1;
    }
    pnVar13 = ha->keys_hash;
  }
  else {
    nVar17 = pnVar13[uVar4].nelts;
    puVar16 = (undefined8 *)((long)pnVar13[uVar4].elts + 8);
    while (bVar19 = nVar17 != 0, nVar17 = nVar17 - 1, bVar19) {
      if ((size == puVar16[-1]) &&
         (iVar3 = strncmp((char *)key->data,(char *)*puVar16,size), iVar3 == 0)) {
        return -3;
      }
      puVar16 = puVar16 + 2;
    }
  }
  psVar6 = (size_t *)ngx_array_push(pnVar13 + uVar4);
  if (psVar6 == (size_t *)0x0) {
    return -1;
  }
  puVar14 = key->data;
  *psVar6 = key->len;
  psVar6[1] = (size_t)puVar14;
  psVar6 = (size_t *)ngx_array_push(&ha->keys);
  if (psVar6 == (size_t *)0x0) {
    return -1;
  }
  puVar14 = key->data;
  *psVar6 = key->len;
  psVar6[1] = (size_t)puVar14;
  nVar17 = ngx_hash_key(key->data,size);
LAB_00115205:
  psVar6[2] = nVar17;
  psVar6[3] = (size_t)value;
  return 0;
}

Assistant:

ngx_int_t
ngx_hash_add_key(ngx_hash_keys_arrays_t *ha, ngx_str_t *key, void *value,
    ngx_uint_t flags)
{
    size_t           len;
    u_char          *p;
    ngx_str_t       *name;
    ngx_uint_t       i, k, n, skip, last;
    ngx_array_t     *keys, *hwc;
    ngx_hash_key_t  *hk;

    last = key->len;

    if (flags & NGX_HASH_WILDCARD_KEY) {

        /*
         * supported wildcards:
         *     "*.example.com", ".example.com", and "www.example.*"
         */

        n = 0;

        for (i = 0; i < key->len; i++) {

            if (key->data[i] == '*') {
                if (++n > 1) {
                    return NGX_DECLINED;
                }
            }

            if (key->data[i] == '.' && key->data[i + 1] == '.') {
                return NGX_DECLINED;
            }

            if (key->data[i] == '\0') {
                return NGX_DECLINED;
            }
        }

        if (key->len > 1 && key->data[0] == '.') {
            skip = 1;
            goto wildcard;
        }

        if (key->len > 2) {

            if (key->data[0] == '*' && key->data[1] == '.') {
                skip = 2;
                goto wildcard;
            }

            if (key->data[i - 2] == '.' && key->data[i - 1] == '*') {
                skip = 0;
                last -= 2;
                goto wildcard;
            }
        }

        if (n) {
            return NGX_DECLINED;
        }
    }

    /* exact hash */

    k = 0;

    for (i = 0; i < last; i++) {
        if (!(flags & NGX_HASH_READONLY_KEY)) {
            key->data[i] = ngx_tolower(key->data[i]);
        }
        k = ngx_hash(k, key->data[i]);
    }

    k %= ha->hsize;

    /* check conflicts in exact hash */

    name = ha->keys_hash[k].elts;

    if (name) {
        for (i = 0; i < ha->keys_hash[k].nelts; i++) {
            if (last != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data, name[i].data, last) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                           sizeof(ngx_str_t))
            != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(&ha->keys_hash[k]);
    if (name == NULL) {
        return NGX_ERROR;
    }

    *name = *key;

    hk = ngx_array_push(&ha->keys);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key = *key;
    hk->key_hash = ngx_hash_key(key->data, last);
    hk->value = value;

    return NGX_OK;


wildcard:

    /* wildcard hash */

    k = ngx_hash_strlow(&key->data[skip], &key->data[skip], last - skip);

    k %= ha->hsize;

    if (skip == 1) {

        /* check conflicts in exact hash for ".example.com" */

        name = ha->keys_hash[k].elts;

        if (name) {
            len = last - skip;

            for (i = 0; i < ha->keys_hash[k].nelts; i++) {
                if (len != name[i].len) {
                    continue;
                }

                if (ngx_strncmp(&key->data[1], name[i].data, len) == 0) {
                    return NGX_BUSY;
                }
            }

        } else {
            if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                               sizeof(ngx_str_t))
                != NGX_OK)
            {
                return NGX_ERROR;
            }
        }

        name = ngx_array_push(&ha->keys_hash[k]);
        if (name == NULL) {
            return NGX_ERROR;
        }

        name->len = last - 1;
        name->data = ngx_pnalloc(ha->temp_pool, name->len);
        if (name->data == NULL) {
            return NGX_ERROR;
        }

        ngx_memcpy(name->data, &key->data[1], name->len);
    }


    if (skip) {

        /*
         * convert "*.example.com" to "com.example.\0"
         *      and ".example.com" to "com.example\0"
         */

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        len = 0;
        n = 0;

        for (i = last - 1; i; i--) {
            if (key->data[i] == '.') {
                ngx_memcpy(&p[n], &key->data[i + 1], len);
                n += len;
                p[n++] = '.';
                len = 0;
                continue;
            }

            len++;
        }

        if (len) {
            ngx_memcpy(&p[n], &key->data[1], len);
            n += len;
        }

        p[n] = '\0';

        hwc = &ha->dns_wc_head;
        keys = &ha->dns_wc_head_hash[k];

    } else {

        /* convert "www.example.*" to "www.example\0" */

        last++;

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        ngx_cpystrn(p, key->data, last);

        hwc = &ha->dns_wc_tail;
        keys = &ha->dns_wc_tail_hash[k];
    }


    /* check conflicts in wildcard hash */

    name = keys->elts;

    if (name) {
        len = last - skip;

        for (i = 0; i < keys->nelts; i++) {
            if (len != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data + skip, name[i].data, len) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(keys, ha->temp_pool, 4, sizeof(ngx_str_t)) != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(keys);
    if (name == NULL) {
        return NGX_ERROR;
    }

    name->len = last - skip;
    name->data = ngx_pnalloc(ha->temp_pool, name->len);
    if (name->data == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(name->data, key->data + skip, name->len);


    /* add to wildcard hash */

    hk = ngx_array_push(hwc);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key.len = last - 1;
    hk->key.data = p;
    hk->key_hash = 0;
    hk->value = value;

    return NGX_OK;
}